

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::impl::anon_unknown_0::xpath_ast_node::is_posinv_expr(xpath_ast_node *this)

{
  bool bVar1;
  undefined1 *in_RDI;
  xpath_ast_node *n;
  xpath_ast_node *in_stack_ffffffffffffffe8;
  xpath_ast_node *this_00;
  bool local_1;
  
  switch(*in_RDI) {
  case 0x10:
  case 0x11:
    local_1 = true;
    break;
  case 0x12:
  case 0x13:
  case 0x14:
    local_1 = true;
    break;
  case 0x15:
  case 0x16:
    local_1 = false;
    break;
  default:
    if ((*(long *)(in_RDI + 8) == 0) || (bVar1 = is_posinv_expr(in_stack_ffffffffffffffe8), bVar1))
    {
      for (this_00 = *(xpath_ast_node **)(in_RDI + 0x10); this_00 != (xpath_ast_node *)0x0;
          this_00 = this_00->_next) {
        bVar1 = is_posinv_expr(this_00);
        if (!bVar1) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
    break;
  case 0x38:
  case 0x39:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool is_posinv_expr() const
		{
			switch (_type)
			{
			case ast_func_position:
			case ast_func_last:
				return false;

			case ast_string_constant:
			case ast_number_constant:
			case ast_variable:
				return true;

			case ast_step:
			case ast_step_root:
				return true;

			case ast_predicate:
			case ast_filter:
				return true;

			default:
				if (_left && !_left->is_posinv_expr()) return false;

				for (xpath_ast_node* n = _right; n; n = n->_next)
					if (!n->is_posinv_expr()) return false;

				return true;
			}
		}